

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.c
# Opt level: O0

int main(void)

{
  int iVar1;
  time_t tVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  float l;
  float b;
  float g;
  float r;
  int height;
  int width;
  GLFWwindow *window;
  thrd_t thread;
  int result;
  
  thread._4_4_ = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  _height = glfwCreateWindow(0x280,0x1e0,"Empty Event Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (_height != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(_height);
    glfwSetKeyCallback(_height,key_callback);
    iVar1 = thrd_create((thrd_t *)&window,thread_main,(void *)0x0);
    if (iVar1 == 1) {
      while (running != '\0') {
        fVar3 = nrand();
        fVar4 = nrand();
        fVar5 = nrand();
        dVar7 = sqrt((double)(fVar5 * fVar5 + fVar3 * fVar3 + fVar4 * fVar4));
        fVar6 = (float)dVar7;
        glfwGetFramebufferSize(_height,(int *)&r,(int *)&g);
        glViewport(0,0,r,g);
        glClearColor(fVar3 / fVar6,fVar4 / fVar6,fVar5 / fVar6,0x3f800000);
        glClear(0x4000);
        glfwSwapBuffers(_height);
        glfwWaitEvents();
        iVar1 = glfwWindowShouldClose(_height);
        if (iVar1 != 0) {
          running = '\0';
        }
      }
      glfwHideWindow(_height);
      thrd_join((thrd_t)window,(int *)&thread);
      glfwDestroyWindow(_height);
      glfwTerminate();
      exit(0);
    }
    fprintf(_stderr,"Failed to create secondary thread\n");
    glfwTerminate();
    exit(1);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(void)
{
    int result;
    thrd_t thread;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(640, 480, "Empty Event Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, key_callback);

    if (thrd_create(&thread, thread_main, NULL) != thrd_success)
    {
        fprintf(stderr, "Failed to create secondary thread\n");

        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    while (running)
    {
        int width, height;
        float r = nrand(), g = nrand(), b = nrand();
        float l = (float) sqrt(r * r + g * g + b * b);

        glfwGetFramebufferSize(window, &width, &height);

        glViewport(0, 0, width, height);
        glClearColor(r / l, g / l, b / l, 1.f);
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(window);

        glfwWaitEvents();

        if (glfwWindowShouldClose(window))
            running = GL_FALSE;
    }

    glfwHideWindow(window);
    thrd_join(thread, &result);
    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}